

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

FlattenTo2DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_flattento2d(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  FlattenTo2DLayerParams *pFVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_flattento2d(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_flattento2d(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pFVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::FlattenTo2DLayerParams>(arena);
    (this->layer_).flattento2d_ = pFVar2;
  }
  return (FlattenTo2DLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FlattenTo2DLayerParams* NeuralNetworkLayer::_internal_mutable_flattento2d() {
  if (!_internal_has_flattento2d()) {
    clear_layer();
    set_has_flattento2d();
    layer_.flattento2d_ = CreateMaybeMessage< ::CoreML::Specification::FlattenTo2DLayerParams >(GetArenaForAllocation());
  }
  return layer_.flattento2d_;
}